

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

int * __thiscall
pbrt::
HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
::operator[](HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
             *this,int *key)

{
  optional<std::pair<int,_int>_> *poVar1;
  size_t sVar2;
  
  sVar2 = FindOffset(this,key);
  poVar1 = (this->table).ptr;
  if (poVar1[sVar2].set != false) {
    return (int *)((long)&poVar1[sVar2].optionalValue + 4);
  }
  LogFatal<char_const(&)[26]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/containers.h"
             ,0x292,"Check failed: %s",(char (*) [26])"table[offset].has_value()");
}

Assistant:

PBRT_CPU_GPU
    const Value &operator[](const Key &key) const {
        size_t offset = FindOffset(key);
        CHECK(table[offset].has_value());
        return table[offset]->second;
    }